

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

ImFont * __thiscall
ImFontAtlas::AddFontFromFileTTF
          (ImFontAtlas *this,char *filename,float size_pixels,ImFontConfig *font_cfg_template,
          ImWchar *glyph_ranges)

{
  void *pvVar1;
  size_t sVar2;
  ImFontAtlas *in_RCX;
  void *in_RDX;
  char *in_RSI;
  bool bVar3;
  float in_XMM0_Da;
  char *p;
  ImFontConfig font_cfg;
  void *data;
  size_t data_size;
  ImFontConfig *in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff30;
  size_t *in_stack_ffffffffffffff38;
  char *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  char local_72 [34];
  ImWchar *in_stack_ffffffffffffffb0;
  ImFontConfig *in_stack_ffffffffffffffb8;
  void *ttf_data;
  char *pcVar4;
  ImFont *pIVar5;
  
  ttf_data = (void *)0x0;
  pvVar1 = ImFileLoadToMemory(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                              in_stack_ffffffffffffff38,
                              (int)((ulong)in_stack_ffffffffffffff30 >> 0x20));
  if (pvVar1 == (void *)0x0) {
    pIVar5 = (ImFont *)0x0;
  }
  else {
    if (in_RDX == (void *)0x0) {
      ImFontConfig::ImFontConfig(in_stack_ffffffffffffff20);
    }
    else {
      memcpy(&stack0xffffffffffffff38,in_RDX,0x88);
    }
    if (local_72[0] == '\0') {
      pcVar4 = in_RSI;
      sVar2 = strlen(in_RSI);
      in_RSI = in_RSI + sVar2;
      while( true ) {
        bVar3 = false;
        if ((pcVar4 < in_RSI) && (bVar3 = false, in_RSI[-1] != '/')) {
          bVar3 = in_RSI[-1] != '\\';
        }
        if (!bVar3) break;
        in_RSI = in_RSI + -1;
      }
      ImFormatString((char *)(double)in_XMM0_Da,(size_t)local_72,(char *)0x28,"%s, %.0fpx",in_RSI);
    }
    pIVar5 = AddFontFromMemoryTTF
                       (in_RCX,ttf_data,(int)((ulong)pvVar1 >> 0x20),SUB84(pvVar1,0),
                        in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  }
  return pIVar5;
}

Assistant:

ImFont* ImFontAtlas::AddFontFromFileTTF(const char* filename, float size_pixels, const ImFontConfig* font_cfg_template, const ImWchar* glyph_ranges)
{
    IM_ASSERT(!Locked && "Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!");
    size_t data_size = 0;
    void* data = ImFileLoadToMemory(filename, "rb", &data_size, 0);
    if (!data)
    {
        IM_ASSERT_USER_ERROR(0, "Could not load font file!");
        return NULL;
    }
    ImFontConfig font_cfg = font_cfg_template ? *font_cfg_template : ImFontConfig();
    if (font_cfg.Name[0] == '\0')
    {
        // Store a short copy of filename into into the font name for convenience
        const char* p;
        for (p = filename + strlen(filename); p > filename && p[-1] != '/' && p[-1] != '\\'; p--) {}
        ImFormatString(font_cfg.Name, IM_ARRAYSIZE(font_cfg.Name), "%s, %.0fpx", p, size_pixels);
    }
    return AddFontFromMemoryTTF(data, (int)data_size, size_pixels, &font_cfg, glyph_ranges);
}